

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O1

void test_parallel_for(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint64_t uid;
  bool bVar2;
  uint __val;
  undefined4 uVar3;
  int __val_00;
  element_type *peVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  undefined8 *puVar8;
  long *plVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  timing_registry *this;
  uint uVar11;
  size_type *psVar12;
  task_group_base *ptVar13;
  ulong uVar14;
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *ppVar15;
  _func_int **pp_Var16;
  undefined8 uVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  uint uVar19;
  uint uVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  test __t;
  undefined1 local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint __uval;
  group_context_base local_128;
  long local_120;
  undefined1 local_118 [16];
  parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_100 [2];
  string __str_2;
  undefined1 local_d0 [32];
  string __str_1;
  shared_ptr<oqpi::simple_partitioner> spPartitioner;
  simple_partitioner local_7c;
  task_handle *local_60;
  _Elt_pointer local_58;
  task_handle local_50;
  task_handle local_40;
  
  test::test(&__t,"test_parallel_for");
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"FibonacciParallelFor","");
  uVar3 = oqpi::
          helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
          ::scheduler_._32_4_;
  __val_00 = gTaskCount;
  local_7c.super_base_partitioner.firstIndex_ = 0;
  local_7c.super_base_partitioner.lastIndex_ = gTaskCount;
  local_7c.super_base_partitioner.elementCount_ = gTaskCount;
  if (gTaskCount <
      (int)oqpi::
           helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
           ::scheduler_._32_4_) {
    local_7c.nbElementsPerBatch_ = 1;
    local_7c.remainder_ = 0;
    __val = gTaskCount;
  }
  else {
    local_7c.nbElementsPerBatch_ =
         gTaskCount /
         (int)oqpi::
              helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              ::scheduler_._32_4_;
    local_7c.remainder_ =
         gTaskCount %
         (int)oqpi::
              helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
              ::scheduler_._32_4_;
    __val = oqpi::
            helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
            ::scheduler_._32_4_;
  }
  local_7c.batchIndex_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_7c.super_base_partitioner.batchCount_ = __val;
  if (gTaskCount < 1) {
    ppVar15 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
    _Var18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0016b7ea;
  }
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,local_60,
             (long)&(local_60->spTask_).
                    super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
             (long)&(local_58->spTask_).
                    super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::append((char *)&__str);
  uVar19 = 1;
  if (9 < (uint)__val_00) {
    uVar11 = __val_00;
    uVar20 = 4;
    do {
      uVar19 = uVar20;
      if (uVar11 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_0016b125;
      }
      if (uVar11 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_0016b125;
      }
      if (uVar11 < 10000) goto LAB_0016b125;
      bVar2 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar20 = uVar19 + 4;
    } while (bVar2);
    uVar19 = uVar19 + 1;
  }
LAB_0016b125:
  local_128.pOwner_ = (task_group_base *)local_118;
  std::__cxx11::string::_M_construct((ulong)&local_128,(char)uVar19);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128.pOwner_,uVar19,__val_00);
  uVar17 = (_func_int **)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    uVar17 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < (_func_int **)(local_120 + __str._M_string_length)) {
    pp_Var16 = (_func_int **)0xf;
    if (local_128.pOwner_ != (task_group_base *)local_118) {
      pp_Var16 = (_func_int **)local_118._0_8_;
    }
    if (pp_Var16 < (_func_int **)(local_120 + __str._M_string_length)) goto LAB_0016b196;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_128,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
  }
  else {
LAB_0016b196:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&__str,(ulong)local_128.pOwner_);
  }
  local_170._0_8_ = local_170 + 0x10;
  plVar9 = puVar8 + 2;
  if ((long *)*puVar8 == plVar9) {
    local_170._16_8_ = *plVar9;
    local_170._24_8_ = puVar8[3];
  }
  else {
    local_170._16_8_ = *plVar9;
    local_170._0_8_ = (long *)*puVar8;
  }
  local_170._8_8_ = puVar8[1];
  *puVar8 = plVar9;
  puVar8[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append(local_170);
  local_d0._0_8_ = local_d0 + 0x10;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar12) {
    local_d0._16_8_ = *psVar12;
    local_d0._24_8_ = plVar9[3];
  }
  else {
    local_d0._16_8_ = *psVar12;
    local_d0._0_8_ = (size_type *)*plVar9;
  }
  local_d0._8_8_ = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
    operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
  }
  if (local_128.pOwner_ != (task_group_base *)local_118) {
    operator_delete(local_128.pOwner_,local_118._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  __str_1._M_dataplus._M_p._0_1_ = 2;
  local_170._0_4_ = __val;
  __str._M_dataplus._M_p = __str._M_dataplus._M_p & 0xffffffff00000000;
  local_108 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,std::allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>,oqpi::scheduler<concurrent_queue>&,std::__cxx11::string_const&,oqpi::task_priority&,int&,int&>
            (a_Stack_100,&local_108,
             (allocator<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
              *)&local_128,
             (scheduler<concurrent_queue> *)
             oqpi::
             helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
             ::scheduler_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
             (task_priority *)&__str_1,(int *)local_170,(int *)&__str);
  std::
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
  ::
  _M_enable_shared_from_this_with<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>>
            ((__shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,(__gnu_cxx::_Lock_policy)2>
              *)&local_108,local_108);
  spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oqpi::simple_partitioner,std::allocator<oqpi::simple_partitioner>,oqpi::simple_partitioner_const&>
            (&spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(simple_partitioner **)&spPartitioner,
             (allocator<oqpi::simple_partitioner> *)local_170,&local_7c);
  if (0 < (int)uVar3) {
    uVar19 = 0;
    do {
      uVar11 = uVar19 + 1;
      uVar20 = 1;
      if (8 < uVar19) {
        uVar6 = uVar11;
        uVar7 = 4;
        do {
          uVar20 = uVar7;
          if (uVar6 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0016b3b2;
          }
          if (uVar6 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0016b3b2;
          }
          if (uVar6 < 10000) goto LAB_0016b3b2;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          uVar7 = uVar20 + 4;
        } while (bVar2);
        uVar20 = uVar20 + 1;
      }
LAB_0016b3b2:
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str_1._M_dataplus._M_p,uVar20,uVar11);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&__str_1,0,(char *)0x0,0x1c989b);
      ptVar13 = (task_group_base *)(plVar9 + 2);
      if ((task_group_base *)*plVar9 == ptVar13) {
        local_118._0_8_ = (ptVar13->super_task_base)._vptr_task_base;
        local_118._8_8_ = plVar9[3];
        local_128.pOwner_ = (task_group_base *)local_118;
      }
      else {
        local_118._0_8_ = (ptVar13->super_task_base)._vptr_task_base;
        local_128.pOwner_ = (task_group_base *)*plVar9;
      }
      paVar1 = &__str.field_2;
      local_120 = plVar9[1];
      *plVar9 = (long)ptVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((size_type *)*plVar9 == psVar12) {
        __str.field_2._M_allocated_capacity = *psVar12;
        __str.field_2._8_8_ = plVar9[3];
        __str._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        __str.field_2._M_allocated_capacity = *psVar12;
        __str._M_dataplus._M_p = (pointer)*plVar9;
      }
      __str._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      uVar20 = 1;
      if (9 < __val) {
        uVar14 = (ulong)__val;
        uVar6 = 4;
        do {
          uVar20 = uVar6;
          uVar7 = (uint)uVar14;
          if (uVar7 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_0016b4ea;
          }
          if (uVar7 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_0016b4ea;
          }
          if (uVar7 < 10000) goto LAB_0016b4ea;
          uVar14 = uVar14 / 10000;
          uVar6 = uVar20 + 4;
        } while (99999 < uVar7);
        uVar20 = uVar20 + 1;
      }
LAB_0016b4ea:
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_2,(char)uVar20);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str_2._M_dataplus._M_p,uVar20,__val);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        uVar17 = __str.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < __str_2._M_string_length + __str._M_string_length) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
          uVar17 = __str_2.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < __str_2._M_string_length + __str._M_string_length) goto LAB_0016b570;
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&__str_2,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
      }
      else {
LAB_0016b570:
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&__str,(ulong)__str_2._M_dataplus._M_p);
      }
      local_170._0_8_ = local_170 + 0x10;
      ppVar15 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                 *)(plVar9 + 2);
      if ((parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)*plVar9 == ppVar15) {
        local_170._16_8_ =
             (ppVar15->
             super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             ).super_task_group_base.super_task_base._vptr_task_base;
        local_170._24_8_ = plVar9[3];
      }
      else {
        local_170._16_8_ =
             (ppVar15->
             super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
             ).super_task_group_base.super_task_base._vptr_task_base;
        local_170._0_8_ =
             (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *)*plVar9;
      }
      local_170._8_8_ = plVar9[1];
      *plVar9 = (long)ppVar15;
      plVar9[1] = 0;
      *(undefined1 *)
       &(ppVar15->
        super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
        ).super_task_group_base.super_task_base._vptr_task_base = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != &__str_2.field_2) {
        operator_delete(__str_2._M_dataplus._M_p,__str_2.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != paVar1) {
        operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
      }
      if (local_128.pOwner_ != (task_group_base *)local_118) {
        operator_delete(local_128.pOwner_,local_118._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      _Var18._M_pi = spPartitioner.
                     super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      peVar4 = spPartitioner.
               super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
      p_Var10->_M_use_count = 1;
      p_Var10->_M_weak_count = 1;
      p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f92a0;
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_001f9078;
      LOCK();
      UNLOCK();
      uVar3 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar5 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var10[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar5;
      p_Var10[1]._M_weak_count = uVar3;
      p_Var10[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var10[2]._M_use_count = 0;
      p_Var10[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var10[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var10[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f92f0;
      *(element_type **)&p_Var10[3]._M_use_count = (element_type *)(p_Var10 + 1);
      this = timing_registry::get();
      uid._0_4_ = p_Var10[1]._M_use_count;
      uid._4_4_ = p_Var10[1]._M_weak_count;
      timing_registry::registerTask(this,uid,(string *)local_170);
      p_Var10[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_001f92f0;
      *(uint *)&p_Var10[4]._vptr__Sp_counted_base = uVar19;
      *(element_type **)&p_Var10[4]._M_use_count = peVar4;
      p_Var10[5]._vptr__Sp_counted_base = (_func_int **)_Var18._M_pi;
      local_40.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var10 + 1);
      local_40.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var10;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(&local_108->
                 super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                ,&local_40);
      if (local_40.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)local_170._0_8_ !=
          (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ + 1);
      }
      uVar19 = uVar11;
    } while (uVar11 != __val);
  }
  _Var18._M_pi = a_Stack_100[0]._M_pi;
  ppVar15 = local_108;
  local_108 = (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
               *)0x0;
  a_Stack_100[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (spPartitioner.super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (spPartitioner.
               super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (a_Stack_100[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_100[0]._M_pi);
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
LAB_0016b7ea:
  if (ppVar15 !=
      (parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
       *)0x0) {
    if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var18._M_pi)->_M_use_count = (_Var18._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var18._M_pi)->_M_use_count = (_Var18._M_pi)->_M_use_count + 1;
      }
    }
    local_170._0_8_ = ppVar15;
    local_170._8_8_ = _Var18._M_pi;
    oqpi::scheduler<concurrent_queue>::add
              ((scheduler<concurrent_queue> *)local_d0,
               (task_handle *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_);
    oqpi::task_handle::validate((task_handle *)local_d0);
    (**(code **)(*(long *)local_d0._0_8_ + 0x28))();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170._8_8_);
    }
  }
  if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,(ulong)((long)&(local_50.spTask_.
                                             super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->_vptr_task_base + 1));
  }
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_for()
{
    TEST_FUNC;

    oqpi_tk::parallel_for("FibonacciParallelFor", gTaskCount, [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
}